

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPMPMultiplayer.cpp
# Opt level: O2

int XPMPGetPlaneModelName(XPMPPlaneID inPlaneID,char *outTxtBuf,int outTxtBufSize)

{
  Aircraft *this;
  string *psVar1;
  string mdlName;
  
  this = XPMP2::AcFindByID(0);
  if (this == (Aircraft *)0x0) {
    mdlName._M_string_length._0_4_ = -1;
  }
  else {
    psVar1 = XPMP2::Aircraft::GetModelName_abi_cxx11_(this);
    std::__cxx11::string::string((string *)&mdlName,(string *)psVar1);
    if (0 < outTxtBufSize && outTxtBuf != (char *)0x0) {
      strncpy(outTxtBuf,mdlName._M_dataplus._M_p,(ulong)(uint)outTxtBufSize);
      outTxtBuf[(ulong)(uint)outTxtBufSize - 1] = '\0';
    }
    std::__cxx11::string::~string((string *)&mdlName);
  }
  return (int)mdlName._M_string_length;
}

Assistant:

int     XPMPGetPlaneModelName(XPMPPlaneID             inPlaneID,
                              char *                  outTxtBuf,
                              int                     outTxtBufSize)
{
    Aircraft* pAc = AcFindByID(inPlaneID);
    if (pAc) {
        std::string mdlName = pAc->GetModelName();
        if (outTxtBuf && outTxtBufSize > 0) {
            strncpy(outTxtBuf, mdlName.c_str(), (size_t)outTxtBufSize);
            outTxtBuf[outTxtBufSize-1] = 0;         // safety measure: ensure zero-termination
        }
        return (int)mdlName.length();
    } else {
        return -1;
    }
}